

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_fold_pclmulqdq_tpl.h
# Opt level: O1

void crc32_fold_pclmulqdq_copy(crc32_fold *crc,uint8_t *dst,uint8_t *src,size_t len)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  uint uVar81;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  ulong uVar93;
  undefined1 auVar92 [16];
  ulong uVar94;
  undefined1 auVar95 [16];
  ulong uVar97;
  undefined1 auVar96 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  __m128i x_tmp1;
  __m128i xmm_crc_part;
  char partial_buf [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined8 local_178;
  undefined8 uStack_170;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined8 local_148;
  undefined8 uStack_140;
  undefined1 local_138 [16];
  undefined8 local_128;
  undefined8 uStack_120;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  ulong uVar82;
  
  local_1a8 = (undefined1  [16])0x0;
  local_138 = (undefined1  [16])0x0;
  auVar92 = *(undefined1 (*) [16])crc->fold;
  auVar96 = *(undefined1 (*) [16])(crc->fold + 0x10);
  auVar99 = *(undefined1 (*) [16])(crc->fold + 0x20);
  auVar85 = *(undefined1 (*) [16])(crc->fold + 0x30);
  if (len < 0x10) {
    if (len == 0) {
      return;
    }
    memcpy(local_138,src,len);
    local_1a8 = local_138;
    memmove(dst,src,len);
    auVar101 = auVar85;
  }
  else {
    uVar81 = -(int)src & 0xf;
    uVar82 = (ulong)uVar81;
    if (uVar81 != 0) {
      auVar101 = *(undefined1 (*) [16])src;
      *(undefined1 (*) [16])dst = auVar101;
      dst = dst + uVar82;
      auVar83 = *(undefined1 (*) [16])(&DAT_0017b570 + (uVar81 << 4));
      auVar84 = pshufb(auVar92,auVar83);
      auVar86 = _DAT_0017b510 ^ auVar83;
      auVar92 = pshufb(auVar92,auVar86);
      auVar87 = pshufb(auVar96,auVar83);
      auVar92 = auVar92 | auVar87;
      auVar96 = pshufb(auVar96,auVar86);
      auVar87 = pshufb(auVar99,auVar83);
      auVar96 = auVar96 | auVar87;
      auVar99 = pshufb(auVar99,auVar86);
      auVar87 = pshufb(auVar85,auVar83);
      auVar99 = auVar99 | auVar87;
      auVar86 = pshufb(auVar85,auVar86);
      local_1a8 = pshufb(auVar101,auVar83);
      auVar101._8_8_ = 0;
      auVar101._0_8_ = auVar84._0_8_;
      auVar85 = (undefined1  [16])0x0;
      for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
        if ((ZEXT816(0x154442bd4) & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
          auVar85 = auVar85 ^ auVar101 << uVar81;
        }
      }
      auVar83._8_8_ = 0;
      auVar83._0_8_ = auVar84._8_8_;
      auVar101 = (undefined1  [16])0x0;
      for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
        if ((ZEXT816(0x1c6e41596) & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
          auVar101 = auVar101 ^ auVar83 << uVar81;
        }
      }
      auVar85 = auVar101 ^ (local_1a8 | auVar86) ^ auVar85;
      src = src + uVar82;
      len = len - uVar82;
    }
    if (0x2bf < len) {
      local_128 = 0xf5e48c85;
      uStack_120 = 0;
      local_178 = 0x1c6e41596;
      uStack_170 = 0;
      do {
        auVar101 = *(undefined1 (*) [16])src;
        local_158 = *(undefined1 (*) [16])((long)src + 0x10);
        local_108 = *(undefined1 (*) [16])((long)src + 0x20);
        local_98 = *(undefined1 (*) [16])((long)src + 0x30);
        local_168 = *(undefined1 (*) [16])((long)src + 0x40);
        uVar77 = *(undefined8 *)*(undefined1 (*) [16])((long)src + 0x50);
        uVar78 = *(undefined8 *)(*(undefined1 (*) [16])((long)src + 0x50) + 8);
        auVar2 = *(undefined1 (*) [16])((long)src + 0x50);
        pauVar1 = (undefined1 (*) [16])((long)src + 0x60);
        local_148 = *(undefined8 *)*pauVar1;
        uStack_140 = *(undefined8 *)(*(undefined1 (*) [16])((long)src + 0x60) + 8);
        auVar47 = *pauVar1;
        local_118 = *pauVar1;
        uVar79 = *(undefined8 *)*(undefined1 (*) [16])((long)src + 0x70);
        uVar80 = *(undefined8 *)(*(undefined1 (*) [16])((long)src + 0x70) + 8);
        auVar88 = *(undefined1 (*) [16])((long)src + 0x70);
        *(undefined1 (*) [16])dst = auVar101;
        *(undefined1 (*) [16])((long)dst + 0x10) = local_158;
        *(undefined1 (*) [16])((long)dst + 0x20) = local_108;
        *(undefined1 (*) [16])((long)dst + 0x30) = local_98;
        *(undefined1 (*) [16])((long)dst + 0x40) = local_168;
        *(undefined8 *)*(undefined1 (*) [16])((long)dst + 0x50) = uVar77;
        *(undefined8 *)(*(undefined1 (*) [16])((long)dst + 0x50) + 8) = uVar78;
        *(undefined8 *)*(undefined1 (*) [16])((long)dst + 0x60) = local_148;
        *(undefined8 *)(*(undefined1 (*) [16])((long)dst + 0x60) + 8) = uStack_140;
        *(undefined8 *)*(undefined1 (*) [16])((long)dst + 0x70) = uVar79;
        *(undefined8 *)(*(undefined1 (*) [16])((long)dst + 0x70) + 8) = uVar80;
        auVar83 = *(undefined1 (*) [16])((long)src + 0x80);
        auVar84 = *(undefined1 (*) [16])((long)src + 0x90);
        auVar86 = *(undefined1 (*) [16])((long)src + 0xa0);
        auVar90._8_8_ = 0;
        auVar90._0_8_ = auVar92._8_8_;
        auVar87 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar90 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar87 = auVar87 ^ ZEXT816(0xf5e48c85) << uVar81;
          }
        }
        auVar90 = *(undefined1 (*) [16])((long)src + 0xb0);
        *(undefined1 (*) [16])((long)dst + 0x80) = auVar83;
        auVar89 = pmovsxdq(local_108,0x596c8d81596c8d81);
        auVar35._8_8_ = 0;
        auVar35._0_8_ = auVar92._0_8_;
        uVar82 = auVar89._8_8_;
        auVar89._8_8_ = 0;
        auVar89._0_8_ = uVar82;
        auVar92 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar35 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar92 = auVar92 ^ auVar89 << uVar81;
          }
        }
        auVar92 = auVar87 ^ local_108 ^ auVar83 ^ auVar92;
        auVar87._8_8_ = 0;
        auVar87._0_8_ = auVar96._8_8_;
        auVar83 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar87 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar83 = auVar83 ^ ZEXT816(0xf5e48c85) << uVar81;
          }
        }
        auVar91._8_8_ = 0;
        auVar91._0_8_ = auVar96._0_8_;
        auVar71._8_8_ = 0;
        auVar71._0_8_ = uVar82;
        auVar96 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar91 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar96 = auVar96 ^ auVar71 << uVar81;
          }
        }
        *(undefined1 (*) [16])((long)dst + 0x90) = auVar84;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = auVar99._0_8_;
        auVar72._8_8_ = 0;
        auVar72._0_8_ = uVar82;
        auVar87 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar36 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar87 = auVar87 ^ auVar72 << uVar81;
          }
        }
        auVar96 = auVar83 ^ auVar101 ^ local_98 ^ auVar84 ^ auVar96;
        auVar84._8_8_ = 0;
        auVar84._0_8_ = auVar99._8_8_;
        auVar99 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar84 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar99 = auVar99 ^ ZEXT816(0xf5e48c85) << uVar81;
          }
        }
        auVar95._8_8_ = 0;
        auVar95._0_8_ = auVar85._8_8_;
        auVar83 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar95 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar83 = auVar83 ^ ZEXT816(0xf5e48c85) << uVar81;
          }
        }
        auVar98._8_8_ = 0;
        auVar98._0_8_ = auVar85._0_8_;
        auVar100._8_8_ = 0;
        auVar100._0_8_ = uVar82;
        auVar85 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar98 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar85 = auVar85 ^ auVar100 << uVar81;
          }
        }
        *(undefined1 (*) [16])((long)dst + 0xa0) = auVar86;
        *(undefined1 (*) [16])((long)dst + 0xb0) = auVar90;
        auVar87 = auVar99 ^ auVar101 ^ local_168 ^ local_158 ^ auVar86 ^ auVar87;
        auVar99 = *(undefined1 (*) [16])((long)src + 0xc0);
        uVar77 = *(undefined8 *)*(undefined1 (*) [16])((long)src + 0xd0);
        uVar78 = *(undefined8 *)(*(undefined1 (*) [16])((long)src + 0xd0) + 8);
        auVar84 = *(undefined1 (*) [16])((long)src + 0xd0);
        auVar85 = auVar83 ^ local_158 ^ auVar2 ^ local_108 ^ auVar90 ^ auVar85;
        local_68 = *(undefined8 *)*(undefined1 (*) [16])((long)src + 0xe0);
        uStack_60 = *(undefined8 *)(*(undefined1 (*) [16])((long)src + 0xe0) + 8);
        auVar90 = *(undefined1 (*) [16])((long)src + 0xe0);
        auVar86._8_8_ = 0;
        auVar86._0_8_ = auVar92._0_8_;
        auVar83 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar86 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar83 = auVar83 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar102._8_8_ = 0;
        auVar102._0_8_ = auVar92._8_8_;
        auVar92 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar102 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar92 = auVar92 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar37._8_8_ = 0;
        auVar37._0_8_ = auVar96._0_8_;
        auVar86 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar37 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar86 = auVar86 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar3._8_8_ = 0;
        auVar3._0_8_ = auVar96._8_8_;
        auVar96 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar3 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar96 = auVar96 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar38._8_8_ = 0;
        auVar38._0_8_ = auVar87._0_8_;
        auVar35 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar38 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar35 = auVar35 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar4._8_8_ = 0;
        auVar4._0_8_ = auVar87._8_8_;
        auVar87 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar4 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar87 = auVar87 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar39._8_8_ = 0;
        auVar39._0_8_ = auVar85._0_8_;
        local_48 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar39 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            local_48 = local_48 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar5._8_8_ = 0;
        auVar5._0_8_ = auVar85._8_8_;
        auVar85 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar5 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar85 = auVar85 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        local_48 = local_48 ^ auVar85;
        local_58 = *(undefined8 *)*(undefined1 (*) [16])((long)src + 0xf0);
        uStack_50 = *(undefined8 *)(*(undefined1 (*) [16])((long)src + 0xf0) + 8);
        auVar85 = *(undefined1 (*) [16])((long)src + 0xf0);
        *(undefined1 (*) [16])((long)dst + 0xc0) = auVar99;
        *(undefined8 *)*(undefined1 (*) [16])((long)dst + 0xd0) = uVar77;
        *(undefined8 *)(*(undefined1 (*) [16])((long)dst + 0xd0) + 8) = uVar78;
        *(undefined8 *)*(undefined1 (*) [16])((long)dst + 0xe0) = local_68;
        *(undefined8 *)(*(undefined1 (*) [16])((long)dst + 0xe0) + 8) = uStack_60;
        *(undefined8 *)*(undefined1 (*) [16])((long)dst + 0xf0) = local_58;
        *(undefined8 *)(*(undefined1 (*) [16])((long)dst + 0xf0) + 8) = uStack_50;
        local_88 = *(undefined8 *)*(undefined1 (*) [16])((long)src + 0x100);
        uStack_80 = *(undefined8 *)(*(undefined1 (*) [16])((long)src + 0x100) + 8);
        auVar89 = *(undefined1 (*) [16])((long)src + 0x100);
        local_78 = *(undefined8 *)*(undefined1 (*) [16])((long)src + 0x110);
        uStack_70 = *(undefined8 *)(*(undefined1 (*) [16])((long)src + 0x110) + 8);
        auVar91 = *(undefined1 (*) [16])((long)src + 0x110);
        local_a8 = *(undefined1 (*) [16])((long)src + 0x120);
        uVar77 = *(undefined8 *)*(undefined1 (*) [16])((long)src + 0x130);
        uVar78 = *(undefined8 *)(*(undefined1 (*) [16])((long)src + 0x130) + 8);
        local_188 = *(undefined1 (*) [16])((long)src + 0x130);
        *(undefined8 *)*(undefined1 (*) [16])((long)dst + 0x100) = local_88;
        *(undefined8 *)(*(undefined1 (*) [16])((long)dst + 0x100) + 8) = uStack_80;
        *(undefined8 *)*(undefined1 (*) [16])((long)dst + 0x110) = local_78;
        *(undefined8 *)(*(undefined1 (*) [16])((long)dst + 0x110) + 8) = uStack_70;
        *(undefined1 (*) [16])((long)dst + 0x120) = local_a8;
        *(undefined8 *)*(undefined1 (*) [16])((long)dst + 0x130) = uVar77;
        *(undefined8 *)(*(undefined1 (*) [16])((long)dst + 0x130) + 8) = uVar78;
        local_118 = local_118 ^ auVar101;
        local_a8 = local_a8 ^ local_108;
        auVar98 = auVar101 ^ local_98 ^ local_108;
        local_e8 = *(undefined1 (*) [16])((long)src + 0x140);
        local_d8 = *(undefined8 *)*(undefined1 (*) [16])((long)src + 0x150);
        uStack_d0 = *(undefined8 *)(*(undefined1 (*) [16])((long)src + 0x150) + 8);
        auVar71 = *(undefined1 (*) [16])((long)src + 0x150);
        local_c8 = *(undefined8 *)*(undefined1 (*) [16])((long)src + 0x160);
        uStack_c0 = *(undefined8 *)(*(undefined1 (*) [16])((long)src + 0x160) + 8);
        auVar36 = *(undefined1 (*) [16])((long)src + 0x160);
        local_b8 = *(undefined8 *)*(undefined1 (*) [16])((long)src + 0x170);
        uStack_b0 = *(undefined8 *)(*(undefined1 (*) [16])((long)src + 0x170) + 8);
        auVar72 = *(undefined1 (*) [16])((long)src + 0x170);
        *(undefined1 (*) [16])((long)dst + 0x140) = local_e8;
        local_e8 = local_e8 ^ auVar101 ^ local_168;
        local_f8 = auVar101 ^ local_168 ^ local_158 ^ local_108;
        auVar95 = local_108 ^ local_98;
        auVar100 = auVar95 ^ local_118 ^ auVar99 ^ auVar83 ^ auVar92;
        auVar102 = auVar88 ^ local_158;
        local_188 = local_188 ^ local_98;
        auVar83 = local_98 ^ local_168 ^ auVar102 ^ auVar84 ^ auVar86 ^ auVar96;
        auVar99 = auVar90 ^ local_168 ^ auVar2 ^ auVar35 ^ auVar87;
        auVar85 = auVar85 ^ auVar2 ^ local_118 ^ local_48;
        auVar96._8_8_ = 0;
        auVar96._0_8_ = auVar100._0_8_;
        auVar92 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar96 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar92 = auVar92 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar6._8_8_ = 0;
        auVar6._0_8_ = auVar100._8_8_;
        auVar96 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar6 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar96 = auVar96 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar40._8_8_ = 0;
        auVar40._0_8_ = auVar83._0_8_;
        auVar84 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar40 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar84 = auVar84 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar7._8_8_ = 0;
        auVar7._0_8_ = auVar83._8_8_;
        auVar83 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar7 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar83 = auVar83 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar41._8_8_ = 0;
        auVar41._0_8_ = auVar99._0_8_;
        auVar86 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar41 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar86 = auVar86 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar8._8_8_ = 0;
        auVar8._0_8_ = auVar99._8_8_;
        auVar99 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar8 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar99 = auVar99 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar42._8_8_ = 0;
        auVar42._0_8_ = auVar85._0_8_;
        auVar87 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar42 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar87 = auVar87 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar9._8_8_ = 0;
        auVar9._0_8_ = auVar85._8_8_;
        auVar85 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar9 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar85 = auVar85 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar96 = auVar47 ^ auVar102 ^ auVar89 ^ auVar92 ^ auVar96;
        auVar83 = auVar91 ^ auVar88 ^ auVar84 ^ auVar83;
        auVar84 = local_a8 ^ auVar86 ^ auVar99;
        auVar85 = local_188 ^ auVar87 ^ auVar85;
        *(undefined1 (*) [16])((long)dst + 0x150) = auVar71;
        auVar99._8_8_ = 0;
        auVar99._0_8_ = auVar84._8_8_;
        auVar92 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar99 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar92 = auVar92 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar43._8_8_ = 0;
        auVar43._0_8_ = auVar84._0_8_;
        auVar99 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar43 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar99 = auVar99 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar10._8_8_ = 0;
        auVar10._0_8_ = auVar85._8_8_;
        auVar84 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar10 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar84 = auVar84 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar44._8_8_ = 0;
        auVar44._0_8_ = auVar85._0_8_;
        auVar85 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar44 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar85 = auVar85 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar11._8_8_ = 0;
        auVar11._0_8_ = auVar96._8_8_;
        auVar86 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar11 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar86 = auVar86 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar45._8_8_ = 0;
        auVar45._0_8_ = auVar96._0_8_;
        auVar96 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar45 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar96 = auVar96 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar12._8_8_ = 0;
        auVar12._0_8_ = auVar83._8_8_;
        auVar87 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar12 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar87 = auVar87 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar46._8_8_ = 0;
        auVar46._0_8_ = auVar83._0_8_;
        auVar83 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar46 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar83 = auVar83 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        *(undefined1 (*) [16])((long)dst + 0x160) = auVar36;
        auVar90 = local_158 ^ local_108 ^ auVar47 ^ auVar36 ^ auVar99 ^ auVar92;
        auVar99 = local_e8 ^ auVar96 ^ auVar86;
        *(undefined1 (*) [16])((long)dst + 0x170) = auVar72;
        auVar83 = local_158 ^ auVar2 ^ auVar101 ^ auVar71 ^ auVar83 ^ auVar87;
        auVar96 = auVar88 ^ auVar95 ^ auVar72 ^ auVar85 ^ auVar84;
        auVar85._8_8_ = 0;
        auVar85._0_8_ = auVar99._0_8_;
        auVar92 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar85 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar92 = auVar92 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar88._8_8_ = 0;
        auVar88._0_8_ = auVar99._8_8_;
        auVar99 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar88 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar99 = auVar99 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar47._8_8_ = 0;
        auVar47._0_8_ = auVar83._0_8_;
        auVar85 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar47 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar85 = auVar85 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar13._8_8_ = 0;
        auVar13._0_8_ = auVar83._8_8_;
        auVar83 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar13 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar83 = auVar83 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar48._8_8_ = 0;
        auVar48._0_8_ = auVar90._0_8_;
        auVar84 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar48 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar84 = auVar84 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar14._8_8_ = 0;
        auVar14._0_8_ = auVar90._8_8_;
        auVar86 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar14 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar86 = auVar86 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar49._8_8_ = 0;
        auVar49._0_8_ = auVar96._0_8_;
        auVar87 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar49 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar87 = auVar87 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar15._8_8_ = 0;
        auVar15._0_8_ = auVar96._8_8_;
        auVar96 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar15 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar96 = auVar96 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar90 = *(undefined1 (*) [16])((long)src + 0x180);
        auVar88 = *(undefined1 (*) [16])((long)src + 400);
        auVar47 = *(undefined1 (*) [16])((long)src + 0x1a0);
        auVar35 = *(undefined1 (*) [16])((long)src + 0x1b0);
        *(undefined1 (*) [16])((long)dst + 0x180) = auVar90;
        local_198 = auVar101 ^ local_98 ^ local_158 ^ local_168;
        *(undefined1 (*) [16])((long)dst + 400) = auVar88;
        auVar90 = auVar98 ^ local_168 ^ auVar90 ^ auVar92 ^ auVar99;
        auVar89 = local_198 ^ auVar2 ^ auVar88 ^ auVar85 ^ auVar83;
        *(undefined1 (*) [16])((long)dst + 0x1a0) = auVar47;
        auVar88 = local_158 ^ local_168 ^ local_108 ^ auVar2;
        auVar83 = auVar88 ^ local_118 ^ auVar47 ^ auVar84 ^ auVar86;
        auVar86 = auVar98 ^ auVar2 ^ local_118;
        *(undefined1 (*) [16])((long)dst + 0x1b0) = auVar35;
        auVar84 = auVar86 ^ auVar102 ^ auVar35 ^ auVar87 ^ auVar96;
        auVar92 = *(undefined1 (*) [16])((long)src + 0x1c0);
        auVar96 = *(undefined1 (*) [16])((long)src + 0x1d0);
        auVar99 = *(undefined1 (*) [16])((long)src + 0x1e0);
        auVar85 = *(undefined1 (*) [16])((long)src + 0x1f0);
        *(undefined1 (*) [16])((long)dst + 0x1c0) = auVar92;
        *(undefined1 (*) [16])((long)dst + 0x1d0) = auVar96;
        *(undefined1 (*) [16])((long)dst + 0x1e0) = auVar99;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = auVar83._8_8_;
        auVar101 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar16 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar101 = auVar101 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar50._8_8_ = 0;
        auVar50._0_8_ = auVar83._0_8_;
        auVar83 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar50 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar83 = auVar83 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar17._8_8_ = 0;
        auVar17._0_8_ = auVar84._8_8_;
        auVar87 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar17 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar87 = auVar87 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar51._8_8_ = 0;
        auVar51._0_8_ = auVar84._0_8_;
        auVar84 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar51 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar84 = auVar84 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar18._8_8_ = 0;
        auVar18._0_8_ = auVar90._8_8_;
        auVar47 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar18 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar47 = auVar47 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar52._8_8_ = 0;
        auVar52._0_8_ = auVar90._0_8_;
        auVar90 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar52 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar90 = auVar90 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar19._8_8_ = 0;
        auVar19._0_8_ = auVar89._8_8_;
        auVar35 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar19 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar35 = auVar35 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar53._8_8_ = 0;
        auVar53._0_8_ = auVar89._0_8_;
        auVar89 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar53 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar89 = auVar89 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar91 = local_198 ^ local_118 ^ auVar102;
        auVar90 = auVar92 ^ auVar91 ^ auVar90 ^ auVar47;
        auVar101 = auVar86 ^ auVar99 ^ auVar83 ^ auVar101;
        *(undefined1 (*) [16])((long)dst + 0x1f0) = auVar85;
        auVar99 = auVar88 ^ auVar102 ^ auVar96 ^ auVar89 ^ auVar35;
        auVar85 = auVar91 ^ auVar85 ^ auVar84 ^ auVar87;
        auVar92 = *(undefined1 (*) [16])((long)src + 0x200);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = auVar90._8_8_;
        auVar96 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar20 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar96 = auVar96 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar54._8_8_ = 0;
        auVar54._0_8_ = auVar90._0_8_;
        auVar83 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar54 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar83 = auVar83 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar21._8_8_ = 0;
        auVar21._0_8_ = auVar99._8_8_;
        auVar84 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar21 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar84 = auVar84 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar55._8_8_ = 0;
        auVar55._0_8_ = auVar99._0_8_;
        auVar99 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar55 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar99 = auVar99 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar22._8_8_ = 0;
        auVar22._0_8_ = auVar101._8_8_;
        auVar86 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar22 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar86 = auVar86 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar56._8_8_ = 0;
        auVar56._0_8_ = auVar101._0_8_;
        auVar101 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar56 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar101 = auVar101 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar23._8_8_ = 0;
        auVar23._0_8_ = auVar85._8_8_;
        auVar87 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar23 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar87 = auVar87 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar57._8_8_ = 0;
        auVar57._0_8_ = auVar85._0_8_;
        auVar85 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar57 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar85 = auVar85 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar90 = *(undefined1 (*) [16])((long)src + 0x210);
        auVar88 = *(undefined1 (*) [16])((long)src + 0x220);
        auVar47 = *(undefined1 (*) [16])((long)src + 0x230);
        *(undefined1 (*) [16])((long)dst + 0x200) = auVar92;
        *(undefined1 (*) [16])((long)dst + 0x210) = auVar90;
        *(undefined1 (*) [16])((long)dst + 0x220) = auVar88;
        auVar83 = local_f8 ^ auVar2 ^ auVar102 ^ auVar92 ^ auVar83 ^ auVar96;
        auVar86 = auVar95 ^ local_168 ^ local_118 ^ auVar102 ^ auVar88 ^ auVar101 ^ auVar86;
        *(undefined1 (*) [16])((long)dst + 0x230) = auVar47;
        auVar101 = local_158 ^ auVar95 ^ auVar2 ^ local_118 ^ auVar90 ^ auVar99 ^ auVar84;
        auVar84 = local_98 ^ local_168 ^ auVar2 ^ auVar102 ^ auVar47 ^ auVar85 ^ auVar87;
        auVar92 = *(undefined1 (*) [16])((long)src + 0x240);
        auVar96 = *(undefined1 (*) [16])((long)src + 0x250);
        auVar99 = *(undefined1 (*) [16])((long)src + 0x260);
        auVar24._8_8_ = 0;
        auVar24._0_8_ = auVar83._8_8_;
        auVar85 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar24 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar85 = auVar85 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar58._8_8_ = 0;
        auVar58._0_8_ = auVar83._0_8_;
        auVar83 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar58 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar83 = auVar83 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar25._8_8_ = 0;
        auVar25._0_8_ = auVar101._8_8_;
        auVar87 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar25 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar87 = auVar87 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar59._8_8_ = 0;
        auVar59._0_8_ = auVar101._0_8_;
        auVar101 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar59 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar101 = auVar101 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar26._8_8_ = 0;
        auVar26._0_8_ = auVar86._8_8_;
        auVar90 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar26 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar90 = auVar90 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar60._8_8_ = 0;
        auVar60._0_8_ = auVar86._0_8_;
        auVar86 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar60 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar86 = auVar86 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar27._8_8_ = 0;
        auVar27._0_8_ = auVar84._8_8_;
        auVar88 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar27 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar88 = auVar88 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar61._8_8_ = 0;
        auVar61._0_8_ = auVar84._0_8_;
        auVar84 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar61 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar84 = auVar84 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar47 = *(undefined1 (*) [16])((long)src + 0x270);
        *(undefined1 (*) [16])((long)dst + 0x240) = auVar92;
        auVar92 = local_168 ^ auVar2 ^ local_118 ^ auVar92 ^ auVar83 ^ auVar85;
        *(undefined1 (*) [16])((long)dst + 0x250) = auVar96;
        *(undefined1 (*) [16])((long)dst + 0x260) = auVar99;
        auVar99 = local_118 ^ auVar102 ^ auVar99 ^ auVar86 ^ auVar90;
        *(undefined1 (*) [16])((long)dst + 0x270) = auVar47;
        auVar85 = auVar102 ^ auVar47 ^ auVar84 ^ auVar88;
        auVar96 = auVar2 ^ local_118 ^ auVar102 ^ auVar96 ^ auVar101 ^ auVar87;
        dst = (uint8_t *)((long)dst + 0x280);
        len = len - 0x280;
        src = (uint8_t *)((long)src + 0x280);
      } while (0x2bf < len);
    }
    while( true ) {
      uVar82 = auVar92._0_8_;
      uVar93 = auVar92._8_8_;
      uVar94 = auVar96._0_8_;
      uVar97 = auVar96._8_8_;
      if (len < 0x40) break;
      len = len - 0x40;
      auVar101 = *(undefined1 (*) [16])src;
      auVar83 = *(undefined1 (*) [16])((long)src + 0x10);
      auVar84 = *(undefined1 (*) [16])((long)src + 0x20);
      auVar86 = *(undefined1 (*) [16])((long)src + 0x30);
      src = (uint8_t *)((long)src + 0x40);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar93;
      auVar87 = (undefined1  [16])0x0;
      for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
        if ((auVar28 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
          auVar87 = auVar87 ^ ZEXT816(0x1c6e41596) << uVar81;
        }
      }
      auVar62._8_8_ = 0;
      auVar62._0_8_ = uVar82;
      auVar92 = (undefined1  [16])0x0;
      for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
        if ((auVar62 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
          auVar92 = auVar92 ^ ZEXT816(0x154442bd4) << uVar81;
        }
      }
      auVar29._8_8_ = 0;
      auVar29._0_8_ = uVar97;
      auVar90 = (undefined1  [16])0x0;
      for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
        if ((auVar29 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
          auVar90 = auVar90 ^ ZEXT816(0x1c6e41596) << uVar81;
        }
      }
      auVar63._8_8_ = 0;
      auVar63._0_8_ = uVar94;
      auVar96 = (undefined1  [16])0x0;
      for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
        if ((auVar63 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
          auVar96 = auVar96 ^ ZEXT816(0x154442bd4) << uVar81;
        }
      }
      auVar30._8_8_ = 0;
      auVar30._0_8_ = auVar99._8_8_;
      auVar2 = (undefined1  [16])0x0;
      for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
        if ((auVar30 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
          auVar2 = auVar2 ^ ZEXT816(0x1c6e41596) << uVar81;
        }
      }
      auVar64._8_8_ = 0;
      auVar64._0_8_ = auVar99._0_8_;
      auVar99 = (undefined1  [16])0x0;
      for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
        if ((auVar64 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
          auVar99 = auVar99 ^ ZEXT816(0x154442bd4) << uVar81;
        }
      }
      auVar31._8_8_ = 0;
      auVar31._0_8_ = auVar85._8_8_;
      auVar88 = (undefined1  [16])0x0;
      for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
        if ((auVar31 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
          auVar88 = auVar88 ^ ZEXT816(0x1c6e41596) << uVar81;
        }
      }
      auVar65._8_8_ = 0;
      auVar65._0_8_ = auVar85._0_8_;
      auVar85 = (undefined1  [16])0x0;
      for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
        if ((auVar65 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
          auVar85 = auVar85 ^ ZEXT816(0x154442bd4) << uVar81;
        }
      }
      *(undefined1 (*) [16])dst = auVar101;
      *(undefined1 (*) [16])((long)dst + 0x10) = auVar83;
      *(undefined1 (*) [16])((long)dst + 0x20) = auVar84;
      *(undefined1 (*) [16])((long)dst + 0x30) = auVar86;
      dst = (uint8_t *)((long)dst + 0x40);
      auVar92 = auVar87 ^ auVar101 ^ auVar92;
      auVar96 = auVar90 ^ auVar83 ^ auVar96;
      auVar99 = auVar2 ^ auVar84 ^ auVar99;
      auVar85 = auVar88 ^ auVar86 ^ auVar85;
    }
    if (len < 0x30) {
      if (len < 0x20) {
        auVar101 = auVar85;
        if (0xf < len) {
          len = len - 0x10;
          auVar92 = *(undefined1 (*) [16])src;
          src = (uint8_t *)((long)src + 0x10);
          *(undefined1 (*) [16])dst = auVar92;
          dst = (uint8_t *)((long)dst + 0x10);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar93;
          auVar83 = (undefined1  [16])0x0;
          for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
            if ((ZEXT816(0x1c6e41596) & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
              auVar83 = auVar83 ^ auVar2 << uVar81;
            }
          }
          auVar76._8_8_ = 0;
          auVar76._0_8_ = uVar82;
          auVar101 = (undefined1  [16])0x0;
          for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
            if ((auVar76 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
              auVar101 = auVar101 ^ ZEXT816(0x154442bd4) << uVar81;
            }
          }
          auVar101 = auVar83 ^ auVar92 ^ auVar101;
          auVar92 = auVar96;
          auVar96 = auVar99;
          auVar99 = auVar85;
        }
      }
      else {
        len = len - 0x20;
        auVar101 = *(undefined1 (*) [16])src;
        auVar83 = *(undefined1 (*) [16])((long)src + 0x10);
        src = (uint8_t *)((long)src + 0x20);
        *(undefined1 (*) [16])dst = auVar101;
        *(undefined1 (*) [16])((long)dst + 0x10) = auVar83;
        dst = (uint8_t *)((long)dst + 0x20);
        auVar92._8_8_ = 0;
        auVar92._0_8_ = uVar97;
        auVar84 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar92 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar84 = auVar84 ^ ZEXT816(0x1c6e41596) << uVar81;
          }
        }
        auVar69._8_8_ = 0;
        auVar69._0_8_ = uVar94;
        auVar86 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar69 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar86 = auVar86 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar74._8_8_ = 0;
        auVar74._0_8_ = uVar93;
        auVar87 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((ZEXT816(0x1c6e41596) & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar87 = auVar87 ^ auVar74 << uVar81;
          }
        }
        auVar70._8_8_ = 0;
        auVar70._0_8_ = uVar82;
        auVar90 = (undefined1  [16])0x0;
        for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
          if ((auVar70 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
            auVar90 = auVar90 ^ ZEXT816(0x154442bd4) << uVar81;
          }
        }
        auVar92 = auVar99;
        auVar96 = auVar85;
        auVar99 = auVar90 ^ auVar87 ^ auVar101;
        auVar101 = auVar86 ^ auVar84 ^ auVar83;
      }
    }
    else {
      len = len - 0x30;
      auVar96 = *(undefined1 (*) [16])src;
      auVar101 = *(undefined1 (*) [16])((long)src + 0x10);
      auVar83 = *(undefined1 (*) [16])((long)src + 0x20);
      src = (uint8_t *)((long)src + 0x30);
      *(undefined1 (*) [16])dst = auVar96;
      *(undefined1 (*) [16])((long)dst + 0x10) = auVar101;
      *(undefined1 (*) [16])((long)dst + 0x20) = auVar83;
      dst = (uint8_t *)((long)dst + 0x30);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = auVar99._8_8_;
      auVar84 = (undefined1  [16])0x0;
      for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
        if ((auVar32 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
          auVar84 = auVar84 ^ ZEXT816(0x1c6e41596) << uVar81;
        }
      }
      auVar66._8_8_ = 0;
      auVar66._0_8_ = auVar99._0_8_;
      auVar86 = (undefined1  [16])0x0;
      for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
        if ((auVar66 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
          auVar86 = auVar86 ^ ZEXT816(0x154442bd4) << uVar81;
        }
      }
      auVar33._8_8_ = 0;
      auVar33._0_8_ = uVar97;
      auVar99 = (undefined1  [16])0x0;
      for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
        if ((auVar33 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
          auVar99 = auVar99 ^ ZEXT816(0x1c6e41596) << uVar81;
        }
      }
      auVar67._8_8_ = 0;
      auVar67._0_8_ = uVar94;
      auVar87 = (undefined1  [16])0x0;
      for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
        if ((auVar67 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
          auVar87 = auVar87 ^ ZEXT816(0x154442bd4) << uVar81;
        }
      }
      auVar73._8_8_ = 0;
      auVar73._0_8_ = uVar93;
      auVar90 = (undefined1  [16])0x0;
      for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
        if ((ZEXT816(0x1c6e41596) & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
          auVar90 = auVar90 ^ auVar73 << uVar81;
        }
      }
      auVar68._8_8_ = 0;
      auVar68._0_8_ = uVar82;
      auVar2 = (undefined1  [16])0x0;
      for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
        if ((auVar68 & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
          auVar2 = auVar2 ^ ZEXT816(0x154442bd4) << uVar81;
        }
      }
      auVar92 = auVar85;
      auVar96 = auVar2 ^ auVar90 ^ auVar96;
      auVar99 = auVar87 ^ auVar99 ^ auVar101;
      auVar101 = auVar86 ^ auVar84 ^ auVar83;
    }
  }
  if (len != 0) {
    memcpy(local_1a8,src,len);
    local_138 = local_1a8;
    memcpy(dst,local_138,len);
    auVar85 = *(undefined1 (*) [16])(&DAT_0017b570 + len * 0x10);
    auVar83 = pshufb(auVar92,auVar85);
    auVar84 = _DAT_0017b510 ^ auVar85;
    auVar92 = pshufb(auVar92,auVar84);
    auVar86 = pshufb(auVar96,auVar85);
    auVar92 = auVar92 | auVar86;
    auVar96 = pshufb(auVar96,auVar84);
    auVar86 = pshufb(auVar99,auVar85);
    auVar96 = auVar96 | auVar86;
    auVar99 = pshufb(auVar99,auVar84);
    auVar86 = pshufb(auVar101,auVar85);
    auVar99 = auVar99 | auVar86;
    auVar84 = pshufb(auVar101,auVar84);
    auVar85 = pshufb(local_1a8,auVar85);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = auVar83._0_8_;
    auVar101 = (undefined1  [16])0x0;
    for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
      if ((ZEXT816(0x154442bd4) & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
        auVar101 = auVar101 ^ auVar34 << uVar81;
      }
    }
    auVar75._8_8_ = 0;
    auVar75._0_8_ = auVar83._8_8_;
    auVar83 = (undefined1  [16])0x0;
    for (uVar81 = 0; uVar81 < 0x40; uVar81 = uVar81 + 1) {
      if ((ZEXT816(0x1c6e41596) & (undefined1  [16])0x1 << uVar81) != (undefined1  [16])0x0) {
        auVar83 = auVar83 ^ auVar75 << uVar81;
      }
    }
    auVar101 = auVar83 ^ (auVar85 | auVar84) ^ auVar101;
  }
  *(undefined1 (*) [16])crc->fold = auVar92;
  *(undefined1 (*) [16])(crc->fold + 0x10) = auVar96;
  *(undefined1 (*) [16])(crc->fold + 0x20) = auVar99;
  *(undefined1 (*) [16])(crc->fold + 0x30) = auVar101;
  return;
}

Assistant:

Z_INTERNAL void CRC32_FOLD(crc32_fold *crc, const uint8_t *src, size_t len, uint32_t init_crc) {
#endif
    unsigned long algn_diff;
    __m128i xmm_t0, xmm_t1, xmm_t2, xmm_t3;
    __m128i xmm_crc0, xmm_crc1, xmm_crc2, xmm_crc3;
    __m128i xmm_crc_part = _mm_setzero_si128();
    char ALIGNED_(16) partial_buf[16] = { 0 };
#ifndef COPY
    __m128i xmm_initial = _mm_cvtsi32_si128(init_crc);
    int32_t first = init_crc != 0;

    /* The CRC functions don't call this for input < 16, as a minimum of 16 bytes of input is needed
     * for the aligning load that occurs.  If there's an initial CRC, to carry it forward through
     * the folded CRC there must be 16 - src % 16 + 16 bytes available, which by definition can be
     * up to 15 bytes + one full vector load. */
    assert(len >= 16 || first == 0);
#endif
    crc32_fold_load((__m128i *)crc->fold, &xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);

    if (len < 16) {
        if (len == 0)
            return;

        memcpy(partial_buf, src, len);
        xmm_crc_part = _mm_load_si128((const __m128i *)partial_buf);
#ifdef COPY
        memcpy(dst, partial_buf, len);
#endif
        goto partial;
    }

    algn_diff = ((uintptr_t)16 - ((uintptr_t)src & 0xF)) & 0xF;
    if (algn_diff) {
        xmm_crc_part = _mm_loadu_si128((__m128i *)src);
#ifdef COPY
        _mm_storeu_si128((__m128i *)dst, xmm_crc_part);
        dst += algn_diff;
#else
        XOR_INITIAL128(xmm_crc_part);

        if (algn_diff < 4 && init_crc != 0) {
            xmm_t0 = xmm_crc_part;
            if (len >= 32) {
                xmm_crc_part = _mm_loadu_si128((__m128i*)src + 1);
                fold_1(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
                xmm_crc3 = _mm_xor_si128(xmm_crc3, xmm_t0);
            } else {
                memcpy(partial_buf, src + 16, len - 16);
                xmm_crc_part = _mm_load_si128((__m128i*)partial_buf);
                fold_1(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
                xmm_crc3 = _mm_xor_si128(xmm_crc3, xmm_t0);
                src += 16;
                len -= 16;
#ifdef COPY
                dst -= algn_diff;
#endif
                goto partial;
            }

            src += 16;
            len -= 16;
        }
#endif

        partial_fold(algn_diff, &xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3, &xmm_crc_part);

        src += algn_diff;
        len -= algn_diff;
    }

#ifdef X86_VPCLMULQDQ
    if (len >= 256) {
#ifdef COPY
        size_t n = fold_16_vpclmulqdq_copy(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3, dst, src, len);
        dst += n;
#else
        size_t n = fold_16_vpclmulqdq(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3, src, len,
            xmm_initial, first);
        first = 0;
#endif
        len -= n;
        src += n;
    }
#endif

#ifndef WITHOUT_CHORBA
        /* Implement Chorba algorithm from https://arxiv.org/abs/2412.16398
         * We interleave the PCLMUL-base folds with 8x scaled generator
         * polynomial copies; we read 8x QWORDS and then XOR them into
         * the stream at the following offsets: 6, 9, 10, 16, 20, 22,
         * 24, 25, 27, 28, 30, 31, 32 - this is detailed in the paper
         * as "generator_64_bits_unrolled_8" */
        while (len >= 512 + 64 + 16*8) {
            __m128i chorba8 = _mm_loadu_si128((__m128i *)src);
            __m128i chorba7 = _mm_loadu_si128((__m128i *)src + 1);
            __m128i chorba6 = _mm_loadu_si128((__m128i *)src + 2);
            __m128i chorba5 = _mm_loadu_si128((__m128i *)src + 3);
            __m128i chorba4 = _mm_loadu_si128((__m128i *)src + 4);
            __m128i chorba3 = _mm_loadu_si128((__m128i *)src + 5);
            __m128i chorba2 = _mm_loadu_si128((__m128i *)src + 6);
            __m128i chorba1 = _mm_loadu_si128((__m128i *)src + 7);
#ifdef COPY
            _mm_storeu_si128((__m128i *)dst, chorba8);
            _mm_storeu_si128((__m128i *)dst + 1, chorba7);
            _mm_storeu_si128((__m128i *)dst + 2, chorba6);
            _mm_storeu_si128((__m128i *)dst + 3, chorba5);
            _mm_storeu_si128((__m128i *)dst + 4, chorba4);
            _mm_storeu_si128((__m128i *)dst + 5, chorba3);
            _mm_storeu_si128((__m128i *)dst + 6, chorba2);
            _mm_storeu_si128((__m128i *)dst + 7, chorba1);
            dst += 16*8;
#else
            XOR_INITIAL128(chorba8);
#endif
            chorba2 = _mm_xor_si128(chorba2, chorba8);
            chorba1 = _mm_xor_si128(chorba1, chorba7);
            src += 16*8;
            len -= 16*8;

            xmm_t0 = _mm_loadu_si128((__m128i *)src);
            xmm_t1 = _mm_loadu_si128((__m128i *)src + 1);
            xmm_t2 = _mm_loadu_si128((__m128i *)src + 2);
            xmm_t3 = _mm_loadu_si128((__m128i *)src + 3);

            fold_12(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
#ifdef COPY
            _mm_storeu_si128((__m128i *)dst, xmm_t0);
            _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
            _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
            _mm_storeu_si128((__m128i *)dst + 3, xmm_t3);
            dst += 64;
#endif
            xmm_t0 = _mm_xor_si128(xmm_t0, chorba6);
            xmm_t1 = _mm_xor_si128(_mm_xor_si128(xmm_t1, chorba5), chorba8);
            xmm_t2 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t2, chorba4), chorba8), chorba7);
            xmm_t3 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t3, chorba3), chorba7), chorba6);
            xmm_crc0 = _mm_xor_si128(xmm_t0, xmm_crc0);
            xmm_crc1 = _mm_xor_si128(xmm_t1, xmm_crc1);
            xmm_crc2 = _mm_xor_si128(xmm_t2, xmm_crc2);
            xmm_crc3 = _mm_xor_si128(xmm_t3, xmm_crc3);

            xmm_t0 = _mm_loadu_si128((__m128i *)src + 4);
            xmm_t1 = _mm_loadu_si128((__m128i *)src + 5);
            xmm_t2 = _mm_loadu_si128((__m128i *)src + 6);
            xmm_t3 = _mm_loadu_si128((__m128i *)src + 7);

            fold_4(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
#ifdef COPY
            _mm_storeu_si128((__m128i *)dst, xmm_t0);
            _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
            _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
            _mm_storeu_si128((__m128i *)dst + 3, xmm_t3);
            dst += 64;
#endif

            xmm_t0 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t0, chorba2), chorba6), chorba5);
            xmm_t1 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t1, chorba1), chorba4), chorba5);
            xmm_t2 = _mm_xor_si128(_mm_xor_si128(xmm_t2, chorba3), chorba4);
            xmm_t3 = _mm_xor_si128(_mm_xor_si128(xmm_t3, chorba2), chorba3);
            xmm_crc0 = _mm_xor_si128(xmm_t0, xmm_crc0);
            xmm_crc1 = _mm_xor_si128(xmm_t1, xmm_crc1);
            xmm_crc2 = _mm_xor_si128(xmm_t2, xmm_crc2);
            xmm_crc3 = _mm_xor_si128(xmm_t3, xmm_crc3);

            xmm_t0 = _mm_loadu_si128((__m128i *)src + 8);
            xmm_t1 = _mm_loadu_si128((__m128i *)src + 9);
            xmm_t2 = _mm_loadu_si128((__m128i *)src + 10);
            xmm_t3 = _mm_loadu_si128((__m128i *)src + 11);

            fold_4(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
#ifdef COPY
            _mm_storeu_si128((__m128i *)dst, xmm_t0);
            _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
            _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
            _mm_storeu_si128((__m128i *)dst + 3, xmm_t3);
            dst += 64;
#endif

            xmm_t0 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t0, chorba1), chorba2), chorba8);
            xmm_t1 = _mm_xor_si128(_mm_xor_si128(xmm_t1, chorba1), chorba7);
            xmm_t2 = _mm_xor_si128(xmm_t2, chorba6);
            xmm_t3 = _mm_xor_si128(xmm_t3, chorba5);
            xmm_crc0 = _mm_xor_si128(xmm_t0, xmm_crc0);
            xmm_crc1 = _mm_xor_si128(xmm_t1, xmm_crc1);
            xmm_crc2 = _mm_xor_si128(xmm_t2, xmm_crc2);
            xmm_crc3 = _mm_xor_si128(xmm_t3, xmm_crc3);

            xmm_t0 = _mm_loadu_si128((__m128i *)src + 12);
            xmm_t1 = _mm_loadu_si128((__m128i *)src + 13);
            xmm_t2 = _mm_loadu_si128((__m128i *)src + 14);
            xmm_t3 = _mm_loadu_si128((__m128i *)src + 15);

            fold_4(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
#ifdef COPY
            _mm_storeu_si128((__m128i *)dst, xmm_t0);
            _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
            _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
            _mm_storeu_si128((__m128i *)dst + 3, xmm_t3);
            dst += 64;
#endif

            xmm_t0 = _mm_xor_si128(_mm_xor_si128(xmm_t0, chorba4), chorba8);
            xmm_t1 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t1, chorba3), chorba8), chorba7);
            xmm_t2 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t2, chorba2), chorba8), chorba7), chorba6);
            xmm_t3 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t3, chorba1), chorba7), chorba6), chorba5);
            xmm_crc0 = _mm_xor_si128(xmm_t0, xmm_crc0);
            xmm_crc1 = _mm_xor_si128(xmm_t1, xmm_crc1);
            xmm_crc2 = _mm_xor_si128(xmm_t2, xmm_crc2);
            xmm_crc3 = _mm_xor_si128(xmm_t3, xmm_crc3);

            xmm_t0 = _mm_loadu_si128((__m128i *)src + 16);
            xmm_t1 = _mm_loadu_si128((__m128i *)src + 17);
            xmm_t2 = _mm_loadu_si128((__m128i *)src + 18);
            xmm_t3 = _mm_loadu_si128((__m128i *)src + 19);

            fold_4(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
#ifdef COPY
            _mm_storeu_si128((__m128i *)dst, xmm_t0);
            _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
            _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
            _mm_storeu_si128((__m128i *)dst + 3, xmm_t3);
            dst += 64;
#endif

            xmm_t0 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t0, chorba4), chorba8), chorba6), chorba5);
            xmm_t1 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t1, chorba3), chorba4), chorba8), chorba7), chorba5);
            xmm_t2 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t2, chorba2), chorba3), chorba4), chorba7), chorba6);
            xmm_t3 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t3, chorba1), chorba2), chorba3), chorba8), chorba6), chorba5);
            xmm_crc0 = _mm_xor_si128(xmm_t0, xmm_crc0);
            xmm_crc1 = _mm_xor_si128(xmm_t1, xmm_crc1);
            xmm_crc2 = _mm_xor_si128(xmm_t2, xmm_crc2);
            xmm_crc3 = _mm_xor_si128(xmm_t3, xmm_crc3);

            xmm_t0 = _mm_loadu_si128((__m128i *)src + 20);
            xmm_t1 = _mm_loadu_si128((__m128i *)src + 21);
            xmm_t2 = _mm_loadu_si128((__m128i *)src + 22);
            xmm_t3 = _mm_loadu_si128((__m128i *)src + 23);

            fold_4(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
#ifdef COPY
            _mm_storeu_si128((__m128i *)dst, xmm_t0);
            _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
            _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
            _mm_storeu_si128((__m128i *)dst + 3, xmm_t3);
            dst += 64;
#endif

            xmm_t0 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t0, chorba1), chorba2), chorba4), chorba8), chorba7), chorba5);
            xmm_t1 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t1, chorba1), chorba3), chorba4), chorba7), chorba6);
            xmm_t2 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t2, chorba2), chorba3), chorba8), chorba6), chorba5);
            xmm_t3 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t3, chorba1), chorba2), chorba4), chorba8), chorba7), chorba5);
            xmm_crc0 = _mm_xor_si128(xmm_t0, xmm_crc0);
            xmm_crc1 = _mm_xor_si128(xmm_t1, xmm_crc1);
            xmm_crc2 = _mm_xor_si128(xmm_t2, xmm_crc2);
            xmm_crc3 = _mm_xor_si128(xmm_t3, xmm_crc3);

            xmm_t0 = _mm_loadu_si128((__m128i *)src + 24);
            xmm_t1 = _mm_loadu_si128((__m128i *)src + 25);
            xmm_t2 = _mm_loadu_si128((__m128i *)src + 26);
            xmm_t3 = _mm_loadu_si128((__m128i *)src + 27);

            fold_4(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
#ifdef COPY
            _mm_storeu_si128((__m128i *)dst, xmm_t0);
            _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
            _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
            _mm_storeu_si128((__m128i *)dst + 3, xmm_t3);
            dst += 64;
#endif
            xmm_t0 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t0, chorba1), chorba3), chorba4), chorba8), chorba7), chorba6);
            xmm_t1 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t1, chorba2), chorba3), chorba7), chorba6), chorba5);
            xmm_t2 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t2, chorba1), chorba2), chorba4), chorba6), chorba5);
            xmm_t3 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t3, chorba1), chorba3), chorba4), chorba5);
            xmm_crc0 = _mm_xor_si128(xmm_t0, xmm_crc0);
            xmm_crc1 = _mm_xor_si128(xmm_t1, xmm_crc1);
            xmm_crc2 = _mm_xor_si128(xmm_t2, xmm_crc2);
            xmm_crc3 = _mm_xor_si128(xmm_t3, xmm_crc3);

            xmm_t0 = _mm_loadu_si128((__m128i *)src + 28);
            xmm_t1 = _mm_loadu_si128((__m128i *)src + 29);
            xmm_t2 = _mm_loadu_si128((__m128i *)src + 30);
            xmm_t3 = _mm_loadu_si128((__m128i *)src + 31);

            fold_4(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
#ifdef COPY
            _mm_storeu_si128((__m128i *)dst, xmm_t0);
            _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
            _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
            _mm_storeu_si128((__m128i *)dst + 3, xmm_t3);
            dst += 64;
#endif
            xmm_t0 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t0, chorba2), chorba3), chorba4);
            xmm_t1 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t1, chorba1), chorba2), chorba3);
            xmm_t2 = _mm_xor_si128(_mm_xor_si128(xmm_t2, chorba1), chorba2);
            xmm_t3 = _mm_xor_si128(xmm_t3, chorba1);
            xmm_crc0 = _mm_xor_si128(xmm_t0, xmm_crc0);
            xmm_crc1 = _mm_xor_si128(xmm_t1, xmm_crc1);
            xmm_crc2 = _mm_xor_si128(xmm_t2, xmm_crc2);
            xmm_crc3 = _mm_xor_si128(xmm_t3, xmm_crc3);

            len -= 512;
            src += 512;
        }
#endif /* WITHOUT_CHORBA */

    while (len >= 64) {
        len -= 64;
        xmm_t0 = _mm_load_si128((__m128i *)src);
        xmm_t1 = _mm_load_si128((__m128i *)src + 1);
        xmm_t2 = _mm_load_si128((__m128i *)src + 2);
        xmm_t3 = _mm_load_si128((__m128i *)src + 3);
        src += 64;

        fold_4(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
#ifdef COPY
        _mm_storeu_si128((__m128i *)dst, xmm_t0);
        _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
        _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
        _mm_storeu_si128((__m128i *)dst + 3, xmm_t3);
        dst += 64;
#else
        XOR_INITIAL128(xmm_t0);
#endif

        xmm_crc0 = _mm_xor_si128(xmm_crc0, xmm_t0);
        xmm_crc1 = _mm_xor_si128(xmm_crc1, xmm_t1);
        xmm_crc2 = _mm_xor_si128(xmm_crc2, xmm_t2);
        xmm_crc3 = _mm_xor_si128(xmm_crc3, xmm_t3);
    }

    /*
     * len = num bytes left - 64
     */
    if (len >= 48) {
        len -= 48;

        xmm_t0 = _mm_load_si128((__m128i *)src);
        xmm_t1 = _mm_load_si128((__m128i *)src + 1);
        xmm_t2 = _mm_load_si128((__m128i *)src + 2);
        src += 48;
#ifdef COPY
        _mm_storeu_si128((__m128i *)dst, xmm_t0);
        _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
        _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
        dst += 48;
#else
        XOR_INITIAL128(xmm_t0);
#endif
        fold_3(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);

        xmm_crc1 = _mm_xor_si128(xmm_crc1, xmm_t0);
        xmm_crc2 = _mm_xor_si128(xmm_crc2, xmm_t1);
        xmm_crc3 = _mm_xor_si128(xmm_crc3, xmm_t2);
    } else if (len >= 32) {
        len -= 32;

        xmm_t0 = _mm_load_si128((__m128i *)src);
        xmm_t1 = _mm_load_si128((__m128i *)src + 1);
        src += 32;
#ifdef COPY
        _mm_storeu_si128((__m128i *)dst, xmm_t0);
        _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
        dst += 32;
#else
        XOR_INITIAL128(xmm_t0);
#endif
        fold_2(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);

        xmm_crc2 = _mm_xor_si128(xmm_crc2, xmm_t0);
        xmm_crc3 = _mm_xor_si128(xmm_crc3, xmm_t1);
    } else if (len >= 16) {
        len -= 16;
        xmm_t0 = _mm_load_si128((__m128i *)src);
        src += 16;
#ifdef COPY
        _mm_storeu_si128((__m128i *)dst, xmm_t0);
        dst += 16;
#else
        XOR_INITIAL128(xmm_t0);
#endif
        fold_1(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);

        xmm_crc3 = _mm_xor_si128(xmm_crc3, xmm_t0);
    }

partial:
    if (len) {
        memcpy(&xmm_crc_part, src, len);
#ifdef COPY
        _mm_storeu_si128((__m128i *)partial_buf, xmm_crc_part);
        memcpy(dst, partial_buf, len);
#endif
        partial_fold(len, &xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3, &xmm_crc_part);
    }

    crc32_fold_save((__m128i *)crc->fold, &xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
}